

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_>::~TypedAttribute
          (TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this)

{
  void *pvVar1;
  
  if (((this->_attrib).has_value_ == true) &&
     (pvVar1 = *(void **)((long)&(this->_attrib).contained + 0x10), pvVar1 != (void *)0x0)) {
    operator_delete(pvVar1,*(long *)((long)&(this->_attrib).contained + 0x20) - (long)pvVar1);
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }